

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  undefined1 *puVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_dns_entry *pCVar6;
  char *pcVar7;
  
  iVar4 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if ((entry == (Curl_dns_entry **)0x0) || (iVar4 == 0)) {
    puVar1 = &(conn->async).field_0x28;
    *puVar1 = *puVar1 | 1;
    CVar5 = CURLE_OK;
    if (entry == (Curl_dns_entry **)0x0) {
      pCVar6 = (conn->async).dns;
      CVar5 = CURLE_OK;
      goto LAB_0010c74f;
    }
  }
  else {
    pvVar2 = (conn->async).os_specific;
    CVar5 = Curl_addrinfo_callback
                      (conn,*(int *)((long)pvVar2 + 0x48),*(Curl_addrinfo **)((long)pvVar2 + 0x50));
    *(undefined8 *)((long)pvVar2 + 0x50) = 0;
    puVar1 = &(conn->async).field_0x28;
    *puVar1 = *puVar1 | 1;
  }
  pCVar6 = (conn->async).dns;
  *entry = pCVar6;
LAB_0010c74f:
  if (pCVar6 == (Curl_dns_entry *)0x0) {
    uVar3 = *(ulong *)&(conn->bits).field_0x4;
    pcVar7 = "proxy";
    if ((uVar3 & 1) == 0) {
      pcVar7 = "host";
    }
    CVar5 = CURLE_COULDNT_RESOLVE_HOST - ((uint)uVar3 & 1);
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar7,(conn->async).hostname);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return CVar5;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  return thread_wait_resolv(conn, entry, TRUE);
}